

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall VertexAttrib64Bit::Base::LinkProgram(Base *this,GLuint id)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  GLenum GVar2;
  TestError *this_01;
  size_t __n;
  void *__buf;
  allocator<char> local_20e;
  allocator<char> local_20d;
  GLint message_length;
  vector<char,_std::allocator<char>_> message;
  GLint status;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [384];
  
  status = 0;
  (*(this->gl).linkProgram)(id);
  GVar2 = (*(this->gl).getError)();
  glu::checkError(GVar2,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd7);
  (*(this->gl).getProgramiv)(id,0x8b82,&status);
  GVar2 = (*(this->gl).getError)();
  glu::checkError(GVar2,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xda);
  if (status != 0) {
    return;
  }
  message_length = 0;
  message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*(this->gl).getProgramiv)(id,0x8b84,&message_length);
  GVar2 = (*(this->gl).getError)();
  glu::checkError(GVar2,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe2);
  std::vector<char,_std::allocator<char>_>::resize(&message,(long)(message_length + 1));
  (*(this->gl).getProgramInfoLog)
            (id,message_length,&message_length,
             message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start);
  GVar2 = (*(this->gl).getError)();
  __n = 0xe7;
  glu::checkError(GVar2,"GetProgramInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe7);
  pTVar1 = this->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"Program link error",&local_20d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,glcts::fixed_sample_locations_values + 1,&local_20e);
  tcu::LogSection::LogSection((LogSection *)local_1a0,&local_1c0,&local_1e0);
  tcu::LogSection::write((LogSection *)local_1a0,(int)pTVar1,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_1a0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  local_1a0._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Link log:\n");
  std::operator<<((ostream *)this_00,
                  message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  tcu::TestLog::endSection(this->m_log);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
             ,0xef);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Base::LinkProgram(GLuint id) const
{
	GLint status = 0;
	gl.linkProgram(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	gl.getProgramiv(id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	if (GL_FALSE == status)
	{
		GLint				message_length = 0;
		std::vector<GLchar> message;

		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &message_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(message_length + 1);

		gl.getProgramInfoLog(id, message_length, &message_length, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		m_log << tcu::TestLog::Section("Program link error", "");

		m_log << tcu::TestLog::Message << "Link log:\n" << &message[0] << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::EndSection;

		TCU_FAIL("Program linking failed");
	}
}